

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpluginloader.cpp
# Opt level: O0

void __thiscall QPluginLoader::setFileName(QPluginLoader *this,QString *fileName)

{
  bool bVar1;
  QLibraryPrivate *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QString fn;
  LoadHints lh;
  QString *in_stack_ffffffffffffff68;
  QLibraryPrivate *in_stack_ffffffffffffff70;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  QFlagsStorageHelper<QLibrary::LoadHint,_4> local_10;
  Int local_c;
  QLibraryPrivate *this_00;
  
  this_00 = *(QLibraryPrivate **)(in_FS_OFFSET + 0x28);
  local_c = 8;
  if (*(long *)(in_RDI + 0x10) != 0) {
    local_10.super_QFlagsStorage<QLibrary::LoadHint>.i =
         (QFlagsStorage<QLibrary::LoadHint>)QLibraryPrivate::loadHints(in_stack_ffffffffffffff70);
    local_c = (Int)local_10.super_QFlagsStorage<QLibrary::LoadHint>.i;
    QLibraryPrivate::release((QLibraryPrivate *)0x45b7f4);
    *(undefined8 *)(in_RDI + 0x10) = 0;
    *(undefined1 *)(in_RDI + 0x18) = 0;
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  loadHints.i = (Int)((ulong)&local_28 >> 0x20);
  locatePlugin((QString *)fn.d.size);
  QString::QString((QString *)0x45b846);
  pQVar2 = QLibraryPrivate::findOrCreate
                     (&in_stack_ffffffffffffff70->fileName,in_stack_ffffffffffffff68,
                      (LoadHints)loadHints.i);
  *(QLibraryPrivate **)(in_RDI + 0x10) = pQVar2;
  QString::~QString((QString *)0x45b883);
  bVar1 = QString::isEmpty((QString *)0x45b88d);
  if (!bVar1) {
    QLibraryPrivate::updatePluginState(this_00);
  }
  QString::~QString((QString *)0x45b8df);
  if (*(QLibraryPrivate **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPluginLoader::setFileName(const QString &fileName)
{
#if defined(QT_SHARED)
    QLibrary::LoadHints lh = defaultLoadHints;
    if (d) {
        lh = d->loadHints();
        d->release();
        d = nullptr;
        did_load = false;
    }

    const QString fn = locatePlugin(fileName);

    d = QLibraryPrivate::findOrCreate(fn, QString(), lh);
    if (!fn.isEmpty())
        d->updatePluginState();

#else
    qCWarning(qt_lcDebugPlugins, "Cannot load '%ls' into a statically linked Qt library.",
              qUtf16Printable(fileName));
#endif
}